

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O3

int SUNLinSolSolve_SPTFQMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  code *pcVar16;
  code *pcVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  undefined8 uVar24;
  uint uVar25;
  bool bVar26;
  ulong uVar27;
  double dVar28;
  sunrealtype sVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  N_Vector Xv [3];
  sunrealtype cv [3];
  double local_148;
  double local_140;
  int local_124;
  double local_e0;
  double local_d8;
  double local_78;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  double local_48;
  double local_40;
  undefined8 local_38;
  
  piVar1 = (int *)S->content;
  iVar22 = *piVar1;
  uVar2 = *(undefined8 *)(piVar1 + 0x16);
  uVar3 = *(undefined8 *)(piVar1 + 0x18);
  uVar4 = *(undefined8 *)(piVar1 + 0x1a);
  uVar5 = *(undefined8 *)(piVar1 + 0x1c);
  uVar6 = *(undefined8 *)(piVar1 + 0x1e);
  puVar7 = *(undefined8 **)(piVar1 + 0x20);
  uVar8 = *(undefined8 *)(piVar1 + 0x22);
  uVar9 = *(undefined8 *)(piVar1 + 0x24);
  uVar10 = *(undefined8 *)(piVar1 + 0x26);
  uVar11 = *(undefined8 *)(piVar1 + 0x28);
  lVar12 = *(long *)(piVar1 + 0x12);
  lVar13 = *(long *)(piVar1 + 0x14);
  uVar14 = *(undefined8 *)(piVar1 + 10);
  uVar15 = *(undefined8 *)(piVar1 + 0x10);
  pcVar16 = *(code **)(piVar1 + 8);
  pcVar17 = *(code **)(piVar1 + 0xe);
  piVar1[3] = 0;
  uVar25 = piVar1[1];
  uVar23 = uVar25 & 0xfffffffe;
  if (uVar23 == 2) {
    if (piVar1[2] == 0) {
      piVar1[6] = -0x270e;
      return -0x270e;
    }
LAB_00159b50:
    N_VScale(0x3ff0000000000000,b,uVar2);
LAB_00159b94:
    uVar25 = uVar25 | 2;
    if (uVar25 == 3) {
      iVar21 = (*pcVar17)(delta,uVar15,uVar2,uVar9,1);
      bVar26 = iVar21 < 0;
      if (iVar21 == 0) goto LAB_00159bf0;
    }
    else {
      N_VScale(0x3ff0000000000000,uVar2,uVar9);
LAB_00159bf0:
      if (lVar12 == 0) {
        N_VScale(0x3ff0000000000000,uVar9,uVar2);
      }
      else {
        N_VProd(lVar12,uVar9,uVar2);
      }
      local_148 = (double)N_VDotProd(uVar2,uVar2);
      dVar28 = 0.0;
      if (0.0 < local_148) {
        if (local_148 < 0.0) {
          dVar28 = sqrt(local_148);
        }
        else {
          dVar28 = SQRT(local_148);
        }
      }
      *(double *)(piVar1 + 4) = dVar28;
      if (dVar28 <= delta) {
        iVar22 = 0;
        piVar1[2] = 0;
        goto LAB_00159db1;
      }
      if (lVar13 == 0) {
        N_VScale(0x3ff0000000000000,uVar2,uVar9);
      }
      else {
        N_VDiv(uVar2,lVar13,uVar9);
      }
      if (uVar23 == 2) {
        N_VScale(0x3ff0000000000000,uVar9,uVar5);
        iVar21 = (*pcVar17)(delta,uVar15,uVar5,uVar9,2);
        bVar26 = iVar21 < 0;
        if (iVar21 != 0) goto LAB_00159bc4;
      }
      iVar21 = (*pcVar16)(uVar14,uVar9,uVar5);
      bVar26 = iVar21 < 0;
      if (iVar21 != 0) goto LAB_00159d9d;
      if (uVar25 != 3) {
        N_VScale(0x3ff0000000000000,uVar5,uVar9);
LAB_00159e14:
        if (lVar12 == 0) {
          N_VScale(0x3ff0000000000000,uVar9,uVar5);
        }
        else {
          N_VProd(lVar12,uVar9,uVar5);
        }
        N_VScale(0x3ff0000000000000,uVar2,*puVar7);
        N_VScale(0x3ff0000000000000,uVar2,uVar8);
        N_VScale(0x3ff0000000000000,uVar2,uVar6);
        N_VConst(0,uVar4);
        if ((lVar13 != 0) && (piVar1[2] == 0)) {
          N_VProd(lVar13,x);
        }
        if (iVar22 < 1) {
          dVar31 = -1.0;
          bVar18 = false;
        }
        else {
          bVar19 = false;
          bVar18 = true;
          local_78 = 0.0;
          local_e0 = 0.0;
          local_140 = -1.0;
          local_124 = 0;
          sVar29 = -1.0;
          local_d8 = dVar28;
          do {
            piVar1[3] = piVar1[3] + 1;
            dVar30 = (double)N_VDotProd(sVar29,uVar2,uVar5);
            N_VLinearSum(0x3ff0000000000000,uVar8,uVar5,uVar3);
            N_VLinearSum(0x3ff0000000000000,0,uVar8,uVar3,puVar7[1]);
            if (lVar13 != 0) {
              N_VDiv(puVar7[1],lVar13,puVar7[1]);
            }
            if (uVar23 == 2) {
              N_VScale(0x3ff0000000000000,puVar7[1],uVar9);
              iVar21 = (*pcVar17)(delta,uVar15,uVar9,puVar7[1],2);
              bVar26 = iVar21 < 0;
              if (iVar21 != 0) goto LAB_00159bc4;
            }
            iVar21 = (*pcVar16)(uVar14,puVar7[1],uVar9);
            bVar26 = iVar21 < 0;
            if (iVar21 != 0) goto LAB_00159d9d;
            if (uVar25 == 3) {
              iVar21 = (*pcVar17)(delta,uVar15,uVar9,puVar7[1],1);
              bVar26 = iVar21 < 0;
              if (iVar21 != 0) goto LAB_00159bc4;
            }
            else {
              N_VScale(0x3ff0000000000000,uVar9,puVar7[1]);
            }
            if (lVar12 == 0) {
              N_VScale(0x3ff0000000000000,puVar7[1],uVar9);
            }
            else {
              N_VProd(lVar12,puVar7[1],uVar9);
            }
            N_VLinearSum(0x3ff0000000000000,*puVar7,uVar9,puVar7[1]);
            iVar21 = 0;
            bVar26 = true;
            do {
              bVar20 = bVar26;
              uVar24 = uVar3;
              dVar31 = local_140;
              if (bVar20) {
                dVar31 = (double)N_VDotProd(puVar7[1],puVar7[1]);
                local_140 = 0.0;
                if (0.0 < dVar31) {
                  if (dVar31 < 0.0) {
                    local_140 = sqrt(dVar31);
                  }
                  else {
                    local_140 = SQRT(dVar31);
                  }
                }
                dVar32 = (double)N_VDotProd(*puVar7,*puVar7);
                uVar24 = uVar8;
                if (dVar32 <= 0.0) {
                  dVar31 = 0.0;
                  dVar32 = local_140 * 0.0;
                  if (0.0 < dVar32) goto LAB_0015a18f;
                }
                else {
                  if (dVar32 < 0.0) {
                    dVar33 = sqrt(dVar32);
                  }
                  else {
                    dVar33 = SQRT(dVar32);
                  }
                  dVar31 = 0.0;
                  if (0.0 < dVar33 * local_140) {
                    if (dVar32 < 0.0) {
                      dVar32 = sqrt(dVar32);
                    }
                    else {
                      dVar32 = SQRT(dVar32);
                    }
                    dVar32 = dVar32 * local_140;
LAB_0015a18f:
                    if (dVar32 < 0.0) {
                      dVar31 = sqrt(dVar32);
                    }
                    else {
                      dVar31 = SQRT(dVar32);
                    }
                  }
                }
              }
              N_VLinearSum(0x3ff0000000000000,
                           SUB84((local_e0 * local_e0 * local_78) / (local_148 / dVar30),0),uVar24,
                           uVar4,uVar4);
              local_e0 = dVar31 / local_d8;
              dVar31 = local_e0 * local_e0 + 1.0;
              uVar27 = -(ulong)(0.0 < dVar31);
              dVar31 = (double)(~uVar27 & 0x7ff0000000000000 | (ulong)(1.0 / SQRT(dVar31)) & uVar27)
              ;
              local_78 = dVar31 * dVar31 * (local_148 / dVar30);
              if ((iVar21 == 0 && local_124 == 0) && (piVar1[2] != 0)) {
                N_VScale(local_78,uVar4,x);
              }
              else {
                N_VLinearSum(x,uVar4,x);
              }
              local_d8 = local_d8 * local_e0 * dVar31;
              dVar31 = SQRT((double)(iVar21 + 1)) * local_d8;
              *(double *)(piVar1 + 4) = dVar31;
              SUNLogger_QueueMsg(S->sunctx->logger,3,"SUNLinSolSolve_SPTFQMR","iterate-residual",
                                 "nli = %li, resnorm = %.16g",0);
              if (dVar31 <= delta) goto LAB_0015a796;
              if (delta < dVar31) {
                if (lVar13 == 0) {
                  N_VScale(0x3ff0000000000000,x,uVar9);
                }
                else {
                  N_VDiv(x,lVar13,uVar9);
                }
                if (uVar23 == 2) {
                  iVar21 = (*pcVar17)(delta,uVar15,uVar9,uVar10,2);
                  if (iVar21 != 0) goto LAB_0015a803;
                  N_VScale(0x3ff0000000000000,uVar10,uVar9);
                }
                iVar21 = (*pcVar16)(uVar14,uVar9,uVar10);
                bVar26 = iVar21 < 0;
                if (iVar21 != 0) goto LAB_00159d9d;
                if (uVar25 == 3) {
                  iVar21 = (*pcVar17)(delta,uVar15,uVar10,uVar9,1);
                  bVar26 = iVar21 < 0;
                  if (iVar21 != 0) goto LAB_00159bc4;
                }
                else {
                  N_VScale(0x3ff0000000000000,uVar10,uVar9);
                }
                if (lVar12 == 0) {
                  N_VScale(0x3ff0000000000000,uVar9,uVar10);
                }
                else {
                  N_VProd(lVar12,uVar9,uVar10);
                }
                if (!bVar19) {
                  if (uVar25 == 3) {
                    iVar21 = (*pcVar17)(delta,uVar15,b,uVar11,1);
                    bVar26 = iVar21 < 0;
                    if (iVar21 != 0) goto LAB_00159bc4;
                  }
                  else {
                    N_VScale(0x3ff0000000000000,b,uVar11);
                  }
                  if (lVar12 != 0) {
                    N_VProd(lVar12,uVar11);
                  }
                }
                N_VLinearSum(0x3ff0000000000000,0,uVar11,uVar10,uVar9);
                dVar32 = (double)N_VDotProd(uVar9,uVar9);
                dVar31 = 0.0;
                if (0.0 < dVar32) {
                  if (dVar32 < 0.0) {
                    dVar31 = sqrt(dVar32);
                  }
                  else {
                    dVar31 = SQRT(dVar32);
                  }
                }
                *(double *)(piVar1 + 4) = dVar31;
                bVar19 = true;
                if (dVar31 <= delta) goto LAB_0015a796;
              }
              iVar21 = 1;
              bVar26 = false;
            } while (bVar20);
            dVar30 = (double)N_VDotProd(uVar2,puVar7[1]);
            local_148 = dVar30 / local_148;
            N_VLinearSum(0x3ff0000000000000,puVar7[1],uVar3,uVar8);
            local_48 = local_148 * local_148;
            local_38 = 0x3ff0000000000000;
            local_68 = uVar6;
            local_60 = uVar3;
            local_58 = uVar8;
            local_40 = local_148;
            N_VLinearCombination(3,&local_48,&local_68);
            if (lVar13 == 0) {
              N_VScale(0x3ff0000000000000,uVar6,uVar9);
            }
            else {
              N_VDiv(uVar6,lVar13,uVar9);
            }
            if (uVar23 == 2) {
              N_VScale(0x3ff0000000000000,uVar9,uVar5);
              iVar21 = (*pcVar17)(delta,uVar15,uVar5,uVar9,2);
              bVar26 = iVar21 < 0;
              if (iVar21 != 0) goto LAB_00159bc4;
            }
            iVar21 = (*pcVar16)(uVar14,uVar9,uVar5);
            bVar26 = iVar21 < 0;
            if (iVar21 != 0) goto LAB_00159d9d;
            if (uVar25 == 3) {
              iVar21 = (*pcVar17)(delta,uVar15,uVar5,uVar9,1);
              bVar26 = iVar21 < 0;
              if (iVar21 != 0) goto LAB_00159bc4;
            }
            else {
              N_VScale(0x3ff0000000000000,uVar5,uVar9);
            }
            if (lVar12 == 0) {
              N_VScale(0x3ff0000000000000,uVar9,uVar5);
            }
            else {
              N_VProd(lVar12,uVar9,uVar5);
            }
            N_VScale(0x3ff0000000000000,puVar7[1],*puVar7);
            local_124 = local_124 + 1;
            bVar18 = local_124 < iVar22;
            sVar29 = delta;
            local_148 = dVar30;
          } while (local_124 != iVar22);
        }
LAB_0015a796:
        if ((!bVar18) && (dVar28 <= dVar31)) {
          piVar1[2] = 0;
          *(undefined4 *)((long)S->content + 0x18) = 0x322;
          return 0x322;
        }
        if (lVar13 != 0) {
          N_VDiv(delta,x,lVar13,x);
        }
        if (uVar23 == 2) {
          iVar22 = (*pcVar17)(delta,uVar15,x,uVar9,2);
          if (iVar22 != 0) {
LAB_0015a803:
            piVar1[2] = 0;
            *(undefined4 *)((long)S->content + 0x18) = 0xfffffcd8;
            return -0x328;
          }
          N_VScale(0x3ff0000000000000,uVar9,x);
        }
        piVar1[2] = 0;
        if (bVar18) {
          *(undefined4 *)((long)S->content + 0x18) = 0;
          return 0;
        }
        *(undefined4 *)((long)S->content + 0x18) = 0x321;
        return 0x321;
      }
      iVar21 = (*pcVar17)(delta,uVar15,uVar5,uVar9,1);
      bVar26 = iVar21 < 0;
      if (iVar21 == 0) goto LAB_00159e14;
    }
LAB_00159bc4:
    piVar1[2] = 0;
    iVar21 = -0x328;
    iVar22 = 0x325;
  }
  else {
    if (piVar1[2] != 0) goto LAB_00159b50;
    iVar21 = (*pcVar16)(uVar14,x,uVar2);
    bVar26 = iVar21 < 0;
    if (iVar21 == 0) {
      N_VLinearSum(0x3ff0000000000000,b,uVar2,uVar2);
      goto LAB_00159b94;
    }
LAB_00159d9d:
    piVar1[2] = 0;
    iVar21 = -0x325;
    iVar22 = 0x323;
  }
  if (bVar26) {
    iVar22 = iVar21;
  }
LAB_00159db1:
  *(int *)((long)S->content + 0x18) = iVar22;
  return iVar22;
}

Assistant:

int SUNLinSolSolve_SPTFQMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                           N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  sunrealtype alpha, tau, eta, beta, c, sigma, v_bar, omega;
  sunrealtype rho[2];
  sunrealtype r_init_norm, r_curr_norm;
  sunrealtype temp_val;
  sunbooleantype preOnLeft, preOnRight, scale_x, scale_b, converged, b_ok;
  sunbooleantype* zeroguess;
  int n, m, l_max;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* res_norm;
  int* nli;
  N_Vector sx, sb, r_star, q, d, v, p, *r, u, vtemp1, vtemp2, vtemp3;
  sunrealtype cv[3];
  N_Vector Xv[3];
  int status = SUN_SUCCESS;

  /* Make local shorcuts to solver variables. */
  l_max     = SPTFQMR_CONTENT(S)->maxl;
  r_star    = SPTFQMR_CONTENT(S)->r_star;
  q         = SPTFQMR_CONTENT(S)->q;
  d         = SPTFQMR_CONTENT(S)->d;
  v         = SPTFQMR_CONTENT(S)->v;
  p         = SPTFQMR_CONTENT(S)->p;
  r         = SPTFQMR_CONTENT(S)->r;
  u         = SPTFQMR_CONTENT(S)->u;
  vtemp1    = SPTFQMR_CONTENT(S)->vtemp1;
  vtemp2    = SPTFQMR_CONTENT(S)->vtemp2;
  vtemp3    = SPTFQMR_CONTENT(S)->vtemp3;
  sb        = SPTFQMR_CONTENT(S)->s1;
  sx        = SPTFQMR_CONTENT(S)->s2;
  A_data    = SPTFQMR_CONTENT(S)->ATData;
  P_data    = SPTFQMR_CONTENT(S)->PData;
  atimes    = SPTFQMR_CONTENT(S)->ATimes;
  psolve    = SPTFQMR_CONTENT(S)->Psolve;
  zeroguess = &(SPTFQMR_CONTENT(S)->zeroguess);
  nli       = &(SPTFQMR_CONTENT(S)->numiters);
  res_norm  = &(SPTFQMR_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  temp_val = r_curr_norm = -ONE;
  *nli                   = 0;
  converged              = SUNFALSE;
  b_ok                   = SUNFALSE;

  /* set sunbooleantype flags for internal solver options */
  preOnLeft  = ((SPTFQMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
               (SPTFQMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  preOnRight = ((SPTFQMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPTFQMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale_x    = (sx != NULL);
  scale_b    = (sb != NULL);

  /* Check for unsupported use case */
  if (preOnRight && !(*zeroguess))
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_ERR_ARG_INCOMPATIBLE;
    return SUN_ERR_ARG_INCOMPATIBLE;
  }

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set r_star to initial (unscaled) residual r_star = r_0 = b - A*x_0 */
  /* NOTE: if x == 0 then just set residual to b and continue */
  if (*zeroguess)
  {
    N_VScale(ONE, b, r_star);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, r_star);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r_star, r_star);
    SUNCheckLastErr();
  }

  /* Apply left preconditioner and b-scaling to r_star (or really just r_0) */
  if (preOnLeft)
  {
    status = psolve(P_data, r_star, vtemp1, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, r_star, vtemp1);
    SUNCheckLastErr();
  }

  if (scale_b)
  {
    N_VProd(sb, vtemp1, r_star);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp1, r_star);
    SUNCheckLastErr();
  }

  /* Initialize rho[0] */
  /* NOTE: initialized here to reduce number of computations - avoid need
           to compute r_star^T*r_star twice, and avoid needlessly squaring
           values */
  rho[0] = N_VDotProd(r_star, r_star);
  SUNCheckLastErr();

  /* Compute norm of initial residual (r_0) to see if we really need
     to do anything */
  *res_norm = r_init_norm = SUNRsqrt(rho[0]);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "SUNLinSolSolve_SPFTQMR", "initial-residual",
                     "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

  if (r_init_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;
    return (LASTFLAG(S));
  }

  /* Set v = A*r_0 (preconditioned and scaled) */
  if (scale_x)
  {
    N_VDiv(r_star, sx, vtemp1);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, r_star, vtemp1);
    SUNCheckLastErr();
  }

  if (preOnRight)
  {
    N_VScale(ONE, vtemp1, v);
    SUNCheckLastErr();
    status = psolve(P_data, v, vtemp1, delta, SUN_PREC_RIGHT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }

  status = atimes(A_data, vtemp1, v);
  if (status != 0)
  {
    *zeroguess = SUNFALSE;
    LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
    return (LASTFLAG(S));
  }

  if (preOnLeft)
  {
    status = psolve(P_data, v, vtemp1, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, v, vtemp1);
    SUNCheckLastErr();
  }

  if (scale_b)
  {
    N_VProd(sb, vtemp1, v);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp1, v);
    SUNCheckLastErr();
  }

  /* Initialize remaining variables */
  N_VScale(ONE, r_star, r[0]);
  SUNCheckLastErr();
  N_VScale(ONE, r_star, u);
  SUNCheckLastErr();
  N_VScale(ONE, r_star, p);
  SUNCheckLastErr();
  N_VConst(ZERO, d);
  SUNCheckLastErr();

  /* Set x = sx x if non-zero guess */
  if (scale_x && !(*zeroguess))
  {
    N_VProd(sx, x, x);
    SUNCheckLastErr();
  }

  tau   = r_init_norm;
  v_bar = eta = ZERO;

  /* START outer loop */
  for (n = 0; n < l_max; ++n)
  {
    /* Increment linear iteration counter */
    (*nli)++;

    /* sigma = r_star^T*v */
    sigma = N_VDotProd(r_star, v);
    SUNCheckLastErr();

    /* alpha = rho[0]/sigma */
    alpha = rho[0] / sigma;

    /* q = u-alpha*v */
    N_VLinearSum(ONE, u, -alpha, v, q);
    SUNCheckLastErr();

    /* r[1] = r[0]-alpha*A*(u+q) */
    N_VLinearSum(ONE, u, ONE, q, r[1]);
    SUNCheckLastErr();
    if (scale_x)
    {
      N_VDiv(r[1], sx, r[1]);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      N_VScale(ONE, r[1], vtemp1);
      SUNCheckLastErr();
      status = psolve(P_data, vtemp1, r[1], delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }

    status = atimes(A_data, r[1], vtemp1);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }

    if (preOnLeft)
    {
      status = psolve(P_data, vtemp1, r[1], delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, vtemp1, r[1]);
      SUNCheckLastErr();
    }

    if (scale_b)
    {
      N_VProd(sb, r[1], vtemp1);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, r[1], vtemp1);
      SUNCheckLastErr();
    }
    N_VLinearSum(ONE, r[0], -alpha, vtemp1, r[1]);
    SUNCheckLastErr();

    /* START inner loop */
    for (m = 0; m < 2; ++m)
    {
      /* d = [*]+(v_bar^2*eta/alpha)*d */
      /* NOTES:
       *   (1) [*] = u if m == 0, and q if m == 1
       *   (2) using temp_val reduces the number of required computations
       *       if the inner loop is executed twice
       */
      if (m == 0)
      {
        temp_val = N_VDotProd(r[1], r[1]);
        SUNCheckLastErr();
        temp_val = SUNRsqrt(temp_val);
        omega    = N_VDotProd(r[0], r[0]);
        SUNCheckLastErr();
        omega = SUNRsqrt(SUNRsqrt(omega) * temp_val);
        N_VLinearSum(ONE, u, SUNSQR(v_bar) * eta / alpha, d, d);
        SUNCheckLastErr();
      }
      else
      {
        omega = temp_val;
        N_VLinearSum(ONE, q, SUNSQR(v_bar) * eta / alpha, d, d);
        SUNCheckLastErr();
      }

      /* v_bar = omega/tau */
      v_bar = omega / tau;

      /* c = (1+v_bar^2)^(-1/2) */
      c = ONE / SUNRsqrt(ONE + SUNSQR(v_bar));

      /* tau = tau*v_bar*c */
      tau = tau * v_bar * c;

      /* eta = c^2*alpha */
      eta = SUNSQR(c) * alpha;

      /* x = x+eta*d */
      if (n == 0 && m == 0 && *zeroguess)
      {
        N_VScale(eta, d, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, eta, d, x);
        SUNCheckLastErr();
      }

      /* Check for convergence... */
      /* NOTE: just use approximation to norm of residual, if possible */
      *res_norm = r_curr_norm = tau * SUNRsqrt(m + 1);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFOs
      SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                         "SUNLinSolSolve_SPTFQMR", "iterate-residual",
                         "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

      /* Exit inner loop if iteration has converged based upon approximation
         to norm of current residual */
      if (r_curr_norm <= delta)
      {
        converged = SUNTRUE;
        break;
      }

      /* Decide if actual norm of residual vector should be computed */
      /* NOTES:
       *   (1) if r_curr_norm > delta, then check if actual residual norm
       *       is OK (recall we first compute an approximation)
       *   (2) if r_curr_norm >= r_init_norm and m == 1 and n == l_max, then
       *       compute actual residual norm to see if the iteration can be
       *       saved
       *   (3) the scaled and preconditioned right-hand side of the given
       *       linear system (denoted by b) is only computed once, and the
       *       result is stored in vtemp3 so it can be reused - reduces the
       *       number of psovles if using left preconditioning
       */
      if ((r_curr_norm > delta) ||
          (r_curr_norm >= r_init_norm && m == 1 && n == l_max))
      {
        /* Compute norm of residual ||b-A*x||_2 (preconditioned and scaled) */
        if (scale_x)
        {
          N_VDiv(x, sx, vtemp1);
          SUNCheckLastErr();
        }
        else
        {
          N_VScale(ONE, x, vtemp1);
          SUNCheckLastErr();
        }

        if (preOnRight)
        {
          status = psolve(P_data, vtemp1, vtemp2, delta, SUN_PREC_RIGHT);
          if (status != 0)
          {
            *zeroguess  = SUNFALSE;
            LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                       : SUNLS_PSOLVE_FAIL_UNREC;
            return (LASTFLAG(S));
          }
          N_VScale(ONE, vtemp2, vtemp1);
          SUNCheckLastErr();
        }

        status = atimes(A_data, vtemp1, vtemp2);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                     : SUNLS_ATIMES_FAIL_REC;
          return (LASTFLAG(S));
        }

        if (preOnLeft)
        {
          status = psolve(P_data, vtemp2, vtemp1, delta, SUN_PREC_LEFT);
          if (status != 0)
          {
            *zeroguess  = SUNFALSE;
            LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                       : SUNLS_PSOLVE_FAIL_REC;
            return (LASTFLAG(S));
          }
        }
        else
        {
          N_VScale(ONE, vtemp2, vtemp1);
          SUNCheckLastErr();
        }

        if (scale_b)
        {
          N_VProd(sb, vtemp1, vtemp2);
          SUNCheckLastErr();
        }
        else
        {
          N_VScale(ONE, vtemp1, vtemp2);
          SUNCheckLastErr();
        }

        /* Only precondition and scale b once (result saved for reuse) */
        if (!b_ok)
        {
          b_ok = SUNTRUE;
          if (preOnLeft)
          {
            status = psolve(P_data, b, vtemp3, delta, SUN_PREC_LEFT);
            if (status != 0)
            {
              *zeroguess  = SUNFALSE;
              LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                         : SUNLS_PSOLVE_FAIL_REC;
              return (LASTFLAG(S));
            }
          }
          else
          {
            N_VScale(ONE, b, vtemp3);
            SUNCheckLastErr();
          }

          if (scale_b)
          {
            N_VProd(sb, vtemp3, vtemp3);
            SUNCheckLastErr();
          }
        }
        N_VLinearSum(ONE, vtemp3, -ONE, vtemp2, vtemp1);
        SUNCheckLastErr();
        r_curr_norm = N_VDotProd(vtemp1, vtemp1);
        SUNCheckLastErr();
        *res_norm = r_curr_norm = SUNRsqrt(r_curr_norm);

        /* Exit inner loop if inequality condition is satisfied
           (meaning exit if we have converged) */
        if (r_curr_norm <= delta)
        {
          converged = SUNTRUE;
          break;
        }
      }

    } /* END inner loop */

    /* If converged, then exit outer loop as well */
    if (converged == SUNTRUE) { break; }

    /* rho[1] = r_star^T*r_[1] */
    rho[1] = N_VDotProd(r_star, r[1]);
    SUNCheckLastErr();

    /* beta = rho[1]/rho[0] */
    beta = rho[1] / rho[0];

    /* u = r[1]+beta*q */
    N_VLinearSum(ONE, r[1], beta, q, u);
    SUNCheckLastErr();

    /* p = u+beta*(q+beta*p) = beta*beta*p + beta*q + u */
    cv[0] = SUNSQR(beta);
    Xv[0] = p;

    cv[1] = beta;
    Xv[1] = q;

    cv[2] = ONE;
    Xv[2] = u;

    SUNCheckCall(N_VLinearCombination(3, cv, Xv, p));

    /* v = A*p */
    if (scale_x)
    {
      N_VDiv(p, sx, vtemp1);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, p, vtemp1);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      N_VScale(ONE, vtemp1, v);
      SUNCheckLastErr();
      status = psolve(P_data, v, vtemp1, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }

    status = atimes(A_data, vtemp1, v);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }

    if (preOnLeft)
    {
      status = psolve(P_data, v, vtemp1, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, v, vtemp1);
      SUNCheckLastErr();
    }

    if (scale_b)
    {
      N_VProd(sb, vtemp1, v);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp1, v);
      SUNCheckLastErr();
    }

    /* Shift variable values */
    /* NOTE: reduces storage requirements */
    N_VScale(ONE, r[1], r[0]);
    SUNCheckLastErr();
    rho[0] = rho[1];

  } /* END outer loop */

  /* Determine return value */
  /* If iteration converged or residual was reduced, then return current iterate
   * (x) */
  if ((converged == SUNTRUE) || (r_curr_norm < r_init_norm))
  {
    if (scale_x)
    {
      N_VDiv(x, sx, x);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      status = psolve(P_data, x, vtemp1, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_UNREC;
        return (LASTFLAG(S));
      }
      N_VScale(ONE, vtemp1, x);
      SUNCheckLastErr();
    }

    *zeroguess = SUNFALSE;
    if (converged == SUNTRUE) { LASTFLAG(S) = SUN_SUCCESS; }
    else { LASTFLAG(S) = SUNLS_RES_REDUCED; }
    return (LASTFLAG(S));
  }
  else
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_CONV_FAIL;
    return (LASTFLAG(S));
  }
}